

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertion-sort.c
# Opt level: O0

void insertion_sort(int *array,size_t length)

{
  int iVar1;
  bool bVar2;
  void *__ptr;
  ulong local_50;
  size_t o;
  size_t n_1;
  _Bool inserted;
  ulong uStack_38;
  int current;
  size_t buffer_pos;
  size_t n;
  size_t target_len;
  int *buffer;
  size_t length_local;
  int *array_local;
  
  __ptr = malloc(length << 2);
  n = 1;
  for (buffer_pos = 0; buffer_pos < length; buffer_pos = buffer_pos + 1) {
    *(int *)((long)__ptr + buffer_pos * 4) = array[buffer_pos];
  }
  uStack_38 = 1;
  do {
    if (length <= uStack_38) {
      free(__ptr);
      return;
    }
    iVar1 = *(int *)((long)__ptr + uStack_38 * 4);
    bVar2 = false;
    o = 0;
    while( true ) {
      if (n <= o) goto LAB_0010130e;
      if (iVar1 <= array[o]) break;
      o = o + 1;
    }
    for (local_50 = n + 1; o < local_50; local_50 = local_50 - 1) {
      array[local_50] = array[local_50 - 1];
    }
    array[o] = iVar1;
    n = n + 1;
    bVar2 = true;
LAB_0010130e:
    if (!bVar2) {
      array[n] = iVar1;
      n = n + 1;
    }
    uStack_38 = uStack_38 + 1;
  } while( true );
}

Assistant:

void insertion_sort(int* array, const size_t length) {
  int* buffer = (int*)malloc(length * sizeof(int));
  size_t target_len = 1; // populated by the first element, already present
  for (size_t n = 0; n < length; n++) {
    buffer[n] = array[n];
  }
  for (size_t buffer_pos = 1; buffer_pos < length; buffer_pos++) {
    int current = buffer[buffer_pos];
    bool inserted = false;
    for (size_t n = 0; n < target_len; n++) {
      if (array[n] >= current) {
        // shift and insert
        for (size_t o = target_len + 1; o > n; o--) {
          array[o] = array[o - 1];
        }
        array[n] = current;
        target_len++;
        inserted = true;
        break;
      }
    }
    if (!inserted) {
      // push at the end
      array[target_len] = current;
      target_len++;
    }
  }
  free(buffer);
}